

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

void __thiscall QAccessibleTextWidget::setSelection(QAccessibleTextWidget *this)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  
  setSelection((QAccessibleTextWidget *)
               &this[-1].super_QAccessibleWidget.super_QAccessibleActionInterface,in_ESI,in_EDX,
               in_ECX);
  return;
}

Assistant:

void QAccessibleTextWidget::setSelection(int selectionIndex, int startOffset, int endOffset)
{
    if (selectionIndex != 0)
        return;

    QTextCursor cursor = textCursor();
    cursor.setPosition(startOffset, QTextCursor::MoveAnchor);
    cursor.setPosition(endOffset, QTextCursor::KeepAnchor);
    setTextCursor(cursor);
}